

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

void vkt::tessellation::anon_unknown_0::addDefaultPrograms
               (SourceCollections *programCollection,TessPrimitiveType primitiveType,
               SpacingMode spacingMode,WindingUsage windingUsage,PointModeUsage pointModeUsage,
               bool mirrorCoords)

{
  _Bit_iterator *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TessPrimitiveType TVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ProgramSources *pPVar7;
  ostream *poVar8;
  Winding *pWVar9;
  ulong uVar10;
  long lVar11;
  ulong *puVar12;
  pointer pWVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  vector<bool,_std::allocator<bool>_> cases;
  string perVertexInterfaceBlock;
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  ostringstream src;
  ostringstream src_3;
  ostringstream tessEvalCoordSrc;
  undefined1 auStack_588 [12];
  TessPrimitiveType local_57c;
  ulong *local_578;
  vector<bool,_std::allocator<bool>_> local_570;
  ulong local_548;
  SourceCollections *local_540;
  string local_538;
  long *local_518;
  long local_510;
  long local_508 [2];
  ulong local_4f8;
  string local_4f0;
  long *local_4d0;
  long local_4c8;
  long local_4c0 [2];
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> local_4b0;
  uint local_498;
  undefined4 uStack_494;
  value_type local_490 [3];
  ios_base local_428 [264];
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [6];
  ios_base local_2b0 [264];
  uint local_1a8 [2];
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  local_548 = CONCAT44(local_548._4_4_,windingUsage);
  local_578 = (ulong *)CONCAT44(local_578._4_4_,spacingMode);
  local_540 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_588 + (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18)
                    + 0xf0);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"layout(location = 0) in  highp float in_v_attr;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"layout(location = 0) out highp float in_tc_attr;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    in_tc_attr = in_v_attr;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"}\n",2);
  local_320._0_8_ = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"vert","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_540->glslSources,(string *)local_320);
  local_57c = primitiveType;
  std::__cxx11::stringbuf::str();
  local_1a8[0] = 0;
  paVar2 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,
             local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p,
             CONCAT44(local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                      local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset) +
             (long)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1a8[0],local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  if ((_Bit_iterator *)
      local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_588 + (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18)
                    + 0xf0);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"layout(vertices = 1) out;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"layout(location = 0) in highp float in_tc_attr[];\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelInner[0] = in_tc_attr[0];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelInner[1] = in_tc_attr[1];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_498,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"}\n",2);
  local_320._0_8_ = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"tesc","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_540->glslSources,(string *)local_320);
  std::__cxx11::stringbuf::str();
  local_1a8[0] = 3;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,
             local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p,
             CONCAT44(local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                      local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset) +
             (long)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1a8[0],local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  TVar3 = local_57c;
  if ((_Bit_iterator *)
      local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  local_4d0 = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d0,
             "VertexData {\n    vec4 in_gs_tessCoord;\n    int  in_gs_primitiveID;\n}","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (mirrorCoords) {
    if (TVar3 == TESSPRIMITIVETYPE_TRIANGLES) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    float x = gl_TessCoord.x;\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    float y = gl_TessCoord.y;\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    float z = gl_TessCoord.z;\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
                 ,0x62);
      lVar11 = 0x33;
      pcVar5 = "                             : vec4(x, y, z, 0.0);\n";
    }
    else {
      if (TVar3 == TESSPRIMITIVETYPE_QUADS) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    float x = gl_TessCoord.x;\n",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    float y = gl_TessCoord.y;\n",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                   ,0x77);
        lVar11 = 0x6c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
                   ,0x6c);
        pcVar5 = 
        "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
        ;
      }
      else {
        if (TVar3 != TESSPRIMITIVETYPE_ISOLINES) goto LAB_00796eb5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    float x = gl_TessCoord.x;\n",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    float y = gl_TessCoord.y;\n",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    // Mirror one half of each outer edge onto the other half\n",0x3e);
        lVar11 = 0x5c;
        pcVar5 = 
        "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar11);
      lVar11 = 0x35;
      pcVar5 = "                             : vec4(x, y, 0.0, 0.0);\n";
    }
  }
  else {
    lVar11 = 0x38;
    pcVar5 = "    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar11);
  getWindingCases(&local_4b0,(WindingUsage)local_548);
  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  bVar17 = true;
  if (pointModeUsage == POINT_MODE_USAGE_VARY) {
    std::vector<bool,_std::allocator<bool>_>::push_back(&local_570,false);
  }
  else if (pointModeUsage != POINT_MODE_USAGE_USE) {
    bVar17 = false;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_570,bVar17);
  uVar10 = (ulong)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  local_548 = (ulong)TVar3;
  puVar12 = local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p;
  uVar15 = local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if (local_4b0.
      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_4b0.
      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_4f8 = (ulong)local_578 & 0xffffffff;
    pWVar9 = local_4b0.
             super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pWVar13 = local_4b0.
              super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = uVar10;
    do {
      if ((local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p != puVar12) ||
         (iVar4 = (int)uVar10, uVar10 = 0, iVar4 != 0)) {
        uVar16 = 0;
        puVar12 = local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
          pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)auStack_588 +
                            (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18) + 0xf0);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_498,"#extension GL_EXT_tessellation_shader : require\n",0x30)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"layout(",7);
          if (local_57c < TESSPRIMITIVETYPE_LAST) {
            pcVar5 = (char *)(&DAT_00d35e98)[local_548];
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
          }
          else {
            std::ios::clear((int)auStack_588 +
                            (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18) + 0xf0);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,", ",2);
          if ((uint)local_578 < 3) {
            pcVar5 = (&PTR_anon_var_dwarf_1606ce6_00d35eb0)[local_4f8];
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
          }
          else {
            std::ios::clear((int)auStack_588 +
                            (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18) + 0xf0);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,", ",2);
          pcVar5 = (char *)0x0;
          if (*pWVar13 == WINDING_CW) {
            pcVar5 = "cw";
          }
          if (*pWVar13 == WINDING_CCW) {
            pcVar5 = "ccw";
          }
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)auStack_588 +
                            (int)*(undefined8 *)(CONCAT44(uStack_494,local_498) + -0x18) + 0xf0);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,sVar6);
          }
          iVar4 = (int)uVar16;
          bVar17 = (*puVar12 >> (uVar16 & 0x3f) & 1) == 0;
          pcVar5 = ", point_mode";
          if (bVar17) {
            pcVar5 = "";
          }
          lVar11 = 0xc;
          if (bVar17) {
            lVar11 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar5,lVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,") in;\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_498,"layout(location = 0) out ",0x19);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_498,(char *)local_4d0,local_4c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ib_out;\n",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
          std::__cxx11::stringbuf::str();
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_320._0_8_,local_320._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._0_8_ != local_310) {
            operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
          }
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"tese","");
          getProgramName(&local_4f0,&local_538,*pWVar13,
                         (*puVar12 & 1L << ((byte)uVar16 & 0x3f)) != 0);
          pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                             (&local_540->glslSources,&local_4f0);
          std::__cxx11::stringbuf::str();
          local_320._0_4_ = 4;
          local_320._8_8_ = local_310[0]._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_320 + 8),local_518,local_510 + (long)local_518);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pPVar7->sources + (local_320._0_8_ & 0xffffffff),(value_type *)(local_320 + 8)
                     );
          if ((char *)local_320._8_8_ != local_310[0]._M_local_buf + 8) {
            operator_delete((void *)local_320._8_8_,local_310[0]._8_8_ + 1);
          }
          if (local_518 != local_508) {
            operator_delete(local_518,local_508[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
          std::ios_base::~ios_base(local_428);
          puVar12 = puVar12 + (iVar4 == 0x3f);
          uVar15 = iVar4 + 1;
          if (iVar4 == 0x3f) {
            uVar15 = 0;
          }
          uVar16 = (ulong)uVar15;
        } while ((puVar12 !=
                  local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                (uVar15 != local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset));
        uVar10 = (ulong)uVar15;
        pWVar9 = local_4b0.
                 super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar15 = (uint)uVar16;
      pWVar13 = pWVar13 + 1;
    } while (pWVar13 != pWVar9);
  }
  local_578 = local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
  if ((local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p != puVar12) || (uVar15 != 0)) {
    local_548 = local_548 << 2;
    uVar10 = 0;
    do {
      uVar16 = 1L << ((byte)uVar10 & 0x3f);
      local_4f8 = uVar10;
      iVar4 = numVerticesPerPrimitive(local_57c,(*local_578 >> (uVar10 & 0x3f) & 1) != 0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_588 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x268);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"#extension GL_EXT_geometry_shader : require\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"layout(",7);
      pcVar5 = "points";
      if ((*local_578 & uVar16) == 0) {
        if (local_57c < TESSPRIMITIVETYPE_LAST) {
          pcVar5 = &DAT_00b4a894 + *(int *)(&DAT_00b4a894 + local_548);
          goto LAB_00796925;
        }
        std::ios::clear((int)auStack_588 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x268);
      }
      else {
LAB_00796925:
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,") in;\n",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"layout(",7);
      pcVar5 = "points";
      if ((*local_578 & uVar16) == 0) {
        if (local_57c < TESSPRIMITIVETYPE_LAST) {
          pcVar5 = &DAT_00b4a8a0 + *(int *)(&DAT_00b4a8a0 + local_548);
          goto LAB_00796992;
        }
        std::ios::clear((int)auStack_588 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x268);
      }
      else {
LAB_00796992:
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,", max_vertices = ",0x11);
      poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_320,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") out;\n",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"layout(location = 0) in ",0x18);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_4d0,local_4c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ib_in[];\n",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"struct PerPrimitive {\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    int  patchPrimitiveID;\n",0x1b)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    int  primitiveID;\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    vec4 tessCoord[3];\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"};\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n",
                 0x47);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"    int          numPrimitives;\n",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"    PerPrimitive primitive[];\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} sb_out;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"    int index = atomicAdd(sb_out.numPrimitives, 1);\n",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n",0x4b
                );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"    sb_out.primitive[index].primitiveID      = index;\n",0x36);
      if (0 < iVar4) {
        iVar14 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"    sb_out.primitive[index].tessCoord[",0x26);
          poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_320,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]     = ib_in[",0xe);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"].in_gs_tessCoord;\n",0x13);
          iVar14 = iVar14 + 1;
        } while (iVar4 != iVar14);
        if (0 < iVar4) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"    gl_Position = vec4(0.0);\n",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"    EmitVertex();\n",0x12);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"geom","");
      uVar10 = *local_578;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_498,local_538._M_dataplus._M_p,
                          local_538._M_string_length);
      pcVar5 = "_point_mode";
      if ((uVar10 & uVar16) == 0) {
        pcVar5 = "";
        lVar11 = 0;
      }
      else {
        lVar11 = 0xb;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,lVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
      std::ios_base::~ios_base(local_428);
      pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_540->glslSources,&local_4f0)
      ;
      std::__cxx11::stringbuf::str();
      local_498 = 2;
      local_490[0]._M_dataplus._M_p = (pointer)&local_490[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,local_518,local_510 + (long)local_518);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pPVar7->sources + local_498,local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490[0]._M_dataplus._M_p != &local_490[0].field_2) {
        operator_delete(local_490[0]._M_dataplus._M_p,local_490[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_518 != local_508) {
        operator_delete(local_518,local_508[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      iVar4 = (int)local_4f8;
      local_578 = local_578 + (iVar4 == 0x3f);
      uVar15 = iVar4 + 1;
      if (iVar4 == 0x3f) {
        uVar15 = 0;
      }
      uVar10 = (ulong)uVar15;
    } while ((local_578 !=
              local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p) ||
            (puVar12 = local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
            uVar15 != local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset));
  }
  if (puVar12 != (ulong *)0x0) {
    operator_delete(puVar12,(long)local_570.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage - (long)puVar12);
  }
  if (local_4b0.
      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>.
      _M_impl.super__Vector_impl_data._M_start != (Winding *)0x0) {
    operator_delete(local_4b0.
                    super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b0.
                          super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.
                          super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00796eb5:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0,local_4c0[0] + 1);
  }
  return;
}

Assistant:

void addDefaultPrograms (vk::SourceCollections&  programCollection,
						 const TessPrimitiveType primitiveType,
						 const SpacingMode       spacingMode,
						 const WindingUsage      windingUsage,
						 const PointModeUsage    pointModeUsage,
						 const bool				 mirrorCoords = false)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	const std::string perVertexInterfaceBlock = \
		"VertexData {\n"					// no in/out qualifier
		"    vec4 in_gs_tessCoord;\n"		// w component is used by mirroring test
		"    int  in_gs_primitiveID;\n"
		"}";								// no newline nor semicolon

	// Alternative tess coordinates handling code
	std::ostringstream tessEvalCoordSrc;
	if (mirrorCoords)
		switch (primitiveType)
		{
			case TESSPRIMITIVETYPE_TRIANGLES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "    float z = gl_TessCoord.z;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
								 << "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
								 << "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
								 << "                             : vec4(x, y, z, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_QUADS:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_ISOLINES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			default:
				DE_ASSERT(false);
				return;
		}
	else
		tessEvalCoordSrc << "    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n";

	const std::vector<Winding> windingCases      = getWindingCases(windingUsage);
	const std::vector<bool>    usePointModeCases = getUsePointModeCases(pointModeUsage);

	for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
	for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
	{
		// Tessellation evaluation shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "\n"
				<< "layout(" << getTessPrimitiveTypeShaderName(primitiveType) << ", "
							 << getSpacingModeShaderName(spacingMode) << ", "
							 << getWindingShaderName(*windingIter)
							 << (*usePointModeIter ? ", point_mode" : "") << ") in;\n"
				<< "\n"
				<< "layout(location = 0) out " << perVertexInterfaceBlock << " ib_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< tessEvalCoordSrc.str()
				<< "    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n"
				<< "}\n";

			programCollection.glslSources.add(getProgramName("tese", *windingIter, *usePointModeIter)) << glu::TessellationEvaluationSource(src.str());
		}
	}  // for windingNdx, usePointModeNdx

	// Geometry shader: data is captured here.
	{
		for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
		{
			const int numVertices = numVerticesPerPrimitive(primitiveType, *usePointModeIter);  // Primitives that the tessellated patch comprises of.

			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_geometry_shader : require\n"
				<< "\n"
				<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ") in;\n"
				<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ", max_vertices = " << numVertices << ") out;\n"
				<< "\n"
				<< "layout(location = 0) in " << perVertexInterfaceBlock << " ib_in[];\n"
				<< "\n"
				<< "struct PerPrimitive {\n"
				<< "    int  patchPrimitiveID;\n"
				<< "    int  primitiveID;\n"
				<< "    vec4 tessCoord[3];\n"
				<< "};\n"
				<< "\n"
				<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
				<< "    int          numPrimitives;\n"
				<< "    PerPrimitive primitive[];\n"
				<< "} sb_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    int index = atomicAdd(sb_out.numPrimitives, 1);\n"
				<< "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n"
				<< "    sb_out.primitive[index].primitiveID      = index;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "    sb_out.primitive[index].tessCoord[" << i << "]     = ib_in[" << i << "].in_gs_tessCoord;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "\n"
					<< "    gl_Position = vec4(0.0);\n"
					<< "    EmitVertex();\n";
			src << "}\n";

			programCollection.glslSources.add(getProgramName("geom", *usePointModeIter)) << glu::GeometrySource(src.str());
		}
	}
}